

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O2

int test_auth_pubkey(LIBSSH2_SESSION *session,int flags,char *username,char *password,char *fn_pub,
                    char *fn_priv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *__stream;
  void *__ptr;
  size_t sVar5;
  size_t sStackY_50;
  
  iVar1 = openssh_fixture_have_docker();
  if ((iVar1 == 0) && (iVar1 = strcmp(username,"libssh2"), iVar1 == 0)) {
    username = getenv("USER");
    if (username == (char *)0x0) {
      username = getenv("LOGNAME");
      goto LAB_00102cce;
    }
LAB_00102cd7:
    sVar2 = strlen(username);
    pcVar3 = (char *)libssh2_userauth_list(session,username,sVar2 & 0xffffffff);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "libssh2_userauth_list";
    }
    else {
      pcVar4 = strstr(pcVar3,"publickey");
      if (pcVar4 == (char *)0x0) {
        fprintf(_stderr,"\'publickey\' was expected in userauth list: %s\n",pcVar3);
        return 1;
      }
      if ((flags & 2U) != 0) {
        pcVar3 = srcdir_path(fn_priv);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "invalid params.\n";
          sStackY_50 = 0x10;
LAB_00102f52:
          fwrite(pcVar3,sStackY_50,1,_stderr);
        }
        else {
          __stream = fopen(pcVar3,"r");
          if (__stream == (FILE *)0x0) {
            pcVar4 = "File could not be read: %s\n";
          }
          else {
            fseek(__stream,0,2);
            sVar2 = ftell(__stream);
            if (-1 < (long)sVar2) {
              fseek(__stream,0,0);
              __ptr = calloc(1,sVar2 + 1);
              if (__ptr == (void *)0x0) {
                fclose(__stream);
                pcVar3 = "Could not alloc memory.\n";
                sStackY_50 = 0x18;
              }
              else {
                sVar5 = fread(__ptr,sVar2,1,__stream);
                fclose(__stream);
                if (sVar5 == 1) {
                  sVar5 = strlen(username);
                  iVar1 = libssh2_userauth_publickey_frommemory
                                    (session,username,sVar5,0,0,__ptr,sVar2,0);
                  free(__ptr);
                  goto LAB_00102e26;
                }
                free(__ptr);
                pcVar3 = "Could not read file into memory.\n";
                sStackY_50 = 0x21;
              }
              goto LAB_00102f52;
            }
            fclose(__stream);
            pcVar4 = "Could not determine input size of: %s\n";
          }
          fprintf(_stderr,pcVar4,pcVar3);
        }
        pcVar3 = "Reading key file failed.\n";
        sStackY_50 = 0x19;
        goto LAB_00102f6e;
      }
      sVar2 = strlen(username);
      pcVar3 = srcdir_path(fn_pub);
      pcVar4 = srcdir_path(fn_priv);
      iVar1 = libssh2_userauth_publickey_fromfile_ex
                        (session,username,sVar2 & 0xffffffff,pcVar3,pcVar4,password);
LAB_00102e26:
      if ((flags & 1U) != 0) {
        if (iVar1 != 0) {
          return 0;
        }
        pcVar3 = "Public-key auth succeeded with wrong key\n";
        sStackY_50 = 0x29;
        goto LAB_00102f6e;
      }
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = "libssh2_userauth_publickey_fromfile_ex";
    }
    print_last_session_error(pcVar3);
  }
  else {
LAB_00102cce:
    if (username != (char *)0x0) goto LAB_00102cd7;
    pcVar3 = "username not set\n";
    sStackY_50 = 0x11;
LAB_00102f6e:
    fwrite(pcVar3,sStackY_50,1,_stderr);
  }
  return 1;
}

Assistant:

int test_auth_pubkey(LIBSSH2_SESSION *session, int flags,
                     const char *username,
                     const char *password,
                     const char *fn_pub,
                     const char *fn_priv)
{
    int rc;
    const char *userauth_list;

    /* Ignore our hard-wired Dockerfile user when not running under Docker */
    if(!openssh_fixture_have_docker() && strcmp(username, "libssh2") == 0) {
        username = getenv("USER");
        if(!username) {
#ifdef _WIN32
            username = getenv("USERNAME");
#else
            username = getenv("LOGNAME");
#endif
        }
    }

    if(!username) {
        fprintf(stderr, "username not set\n");
        return 1;
    }

    userauth_list = libssh2_userauth_list(session, username,
                                          (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    if((flags & TEST_AUTH_FROMMEM) != 0) {
        char *buffer = NULL;
        size_t len = 0;

        if(read_file(srcdir_path(fn_priv), &buffer, &len)) {
            fprintf(stderr, "Reading key file failed.\n");
            return 1;
        }

        rc = libssh2_userauth_publickey_frommemory(session,
                                                   username, strlen(username),
                                                   NULL, 0,
                                                   buffer, len,
                                                   NULL);

        free(buffer);
    }
    else {
        rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                    srcdir_path(fn_pub),
                                                    srcdir_path(fn_priv),
                                                    password);
    }

    if((flags & TEST_AUTH_SHOULDFAIL) != 0) {
        if(rc == 0) {
            fprintf(stderr, "Public-key auth succeeded with wrong key\n");
            return 1;
        }
    }
    else {
        if(rc) {
            print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
            return 1;
        }
    }

    return 0;
}